

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

void __thiscall
CodeGenGenericContext::MemInvalidate(CodeGenGenericContext *this,x86Argument *address)

{
  x86Reg xVar1;
  x86Reg xVar2;
  x86Reg xVar3;
  uint uVar4;
  x86Reg xVar5;
  bool bVar6;
  bool bVar7;
  x86Argument *pxVar8;
  long lVar9;
  
  xVar1 = address->ptrIndex;
  pxVar8 = &this->memCache[0].value;
  lVar9 = 0;
  do {
    if ((((MemCache *)(pxVar8 + -1))->address).type != argNone) {
      bVar6 = address->ptrBase != rEBX;
      bVar7 = xVar1 != rNONE;
      if (bVar6 || bVar7) {
LAB_001e263c:
        if (((((MemCache *)(pxVar8 + -1))->address).ptrIndex != rNONE) ||
           ((((MemCache *)(pxVar8 + -1))->address).ptrBase != rEBX)) {
          if (!bVar6 && !bVar7) goto LAB_001e2651;
          goto LAB_001e26bd;
        }
      }
      else if (((((MemCache *)(pxVar8 + -1))->address).ptrIndex == rNONE) &&
              ((((MemCache *)(pxVar8 + -1))->address).ptrBase == rEBX)) {
        if (bVar6 || bVar7) goto LAB_001e263c;
LAB_001e2651:
        if (((((MemCache *)(pxVar8 + -1))->address).ptrIndex == rNONE) &&
           ((((MemCache *)(pxVar8 + -1))->address).ptrBase == rEBX)) {
          xVar2 = (address->field_1).reg;
          if (xVar2 == rNONE) {
            __assert_fail("address.ptrSize != sNONE",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                          ,0x80,"void CodeGenGenericContext::MemInvalidate(const x86Argument &)");
          }
          xVar3 = (((MemCache *)(pxVar8 + -1))->address).field_1.reg;
          if (xVar3 == rNONE) {
            __assert_fail("write.ptrSize != sNONE",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                          ,0x81,"void CodeGenGenericContext::MemInvalidate(const x86Argument &)");
          }
          xVar5 = (uint)(xVar2 != rECX) * 4 + rEDX;
          if (xVar2 < rECX) {
            xVar5 = xVar2;
          }
          xVar2 = (uint)(xVar3 != rECX) * 4 + rEDX;
          if (xVar3 < rECX) {
            xVar2 = xVar3;
          }
          uVar4 = (((MemCache *)(pxVar8 + -1))->address).ptrNum;
          if (uVar4 < xVar5 + address->ptrNum) {
            if ((uint)address->ptrNum < uVar4 + xVar2) goto LAB_001e26bd;
          }
        }
        else {
LAB_001e26bd:
          (((MemCache *)(pxVar8 + -1))->address).type = argNone;
          pxVar8->type = argNone;
          uVar4 = this->memCacheFreeSlotCount;
          if (0xf < (ulong)uVar4) {
            __assert_fail("memCacheFreeSlotCount < memoryStateSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                          ,0x8d,"void CodeGenGenericContext::MemInvalidate(const x86Argument &)");
          }
          this->memCacheFreeSlotCount = uVar4 + 1;
          this->memCacheFreeSlots[uVar4] = (uint)lVar9;
        }
      }
    }
    lVar9 = lVar9 + 1;
    pxVar8 = (x86Argument *)((long)(pxVar8 + 2) + 8);
    if (lVar9 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

void CodeGenGenericContext::MemInvalidate(const x86Argument &address)
{
	for(unsigned i = 0; i < memoryStateSize; i++)
	{
		MemCache &entry = memCache[i];

		if(entry.address.type == x86Argument::argNone)
			continue;

		x86Argument &write = entry.address;

		// Reading from register file can't mark any memory writes with addresses from other registers since they can't point to it
		if(address.ptrIndex == rNONE && address.ptrBase == rEBX && (write.ptrIndex != rNONE || write.ptrBase != rEBX))
			continue;

		// Reading from an address in a register different from register file can't mark writes to register file as read
		if((address.ptrIndex != rNONE || address.ptrBase != rEBX) && write.ptrIndex == rNONE && write.ptrBase == rEBX)
			continue;

		// When reading and writing from register file, check read range intersection with write range
		if(address.ptrIndex == rNONE && address.ptrBase == rEBX && write.ptrIndex == rNONE && write.ptrBase == rEBX)
		{
			assert(address.ptrSize != sNONE);
			assert(write.ptrSize != sNONE);

			unsigned readSize = address.ptrSize == sBYTE ? 1 : (address.ptrSize == sWORD ? 2 : (address.ptrSize == sDWORD ? 4 : 8));
			unsigned writeSize = write.ptrSize == sBYTE ? 1 : (write.ptrSize == sWORD ? 2 : (write.ptrSize == sDWORD ? 4 : 8));

			if(unsigned(address.ptrNum) + readSize <= unsigned(write.ptrNum) || unsigned(address.ptrNum) >= unsigned(write.ptrNum) + writeSize)
				continue;
		}

		entry.address.type = x86Argument::argNone;
		entry.value.type = x86Argument::argNone;

		assert(memCacheFreeSlotCount < memoryStateSize);
		memCacheFreeSlots[memCacheFreeSlotCount++] = i;
	}
}